

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colour_filters.cpp
# Opt level: O0

array<cv::Mat,_5UL> * filter_image(array<cv::Mat,_5UL> *__return_storage_ptr__,Mat *pretreat)

{
  ulong uVar1;
  size_type sVar2;
  reference this;
  future<cv::Mat> local_f0 [6];
  ulong local_90;
  size_t i;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [8];
  array<std::future<cv::Mat>,_5UL> async_result;
  Mat *pretreat_local;
  array<cv::Mat,_5UL> *result;
  
  async_result._M_elems[4].super___basic_future<cv::Mat>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  std::array<cv::Mat,_5UL>::array(__return_storage_ptr__);
  local_78 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_70;
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_78,(Mat *)filter_yellow);
  local_78 = &async_result._M_elems[0].super___basic_future<cv::Mat>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_78,(Mat *)filter_red);
  local_78 = &async_result._M_elems[1].super___basic_future<cv::Mat>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_78,(Mat *)filter_blue);
  local_78 = &async_result._M_elems[2].super___basic_future<cv::Mat>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_78,(Mat *)filter_black);
  local_78 = &async_result._M_elems[3].super___basic_future<cv::Mat>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((_func_Mat_Mat_ptr *)local_78,(Mat *)filter_white);
  local_90 = 0;
  while( true ) {
    uVar1 = local_90;
    sVar2 = std::array<cv::Mat,_5UL>::size(__return_storage_ptr__);
    if (sVar2 <= uVar1) break;
    std::array<std::future<cv::Mat>,_5UL>::operator[]
              ((array<std::future<cv::Mat>,_5UL> *)local_70,local_90);
    std::future<cv::Mat>::get(local_f0);
    this = std::array<cv::Mat,_5UL>::operator[](__return_storage_ptr__,local_90);
    cv::Mat::operator=(this,(Mat *)local_f0);
    cv::Mat::~Mat((Mat *)local_f0);
    local_90 = local_90 + 1;
  }
  async_result._M_elems[4].super___basic_future<cv::Mat>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  std::array<std::future<cv::Mat>,_5UL>::~array((array<std::future<cv::Mat>,_5UL> *)local_70);
  if ((async_result._M_elems[4].super___basic_future<cv::Mat>._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    std::array<cv::Mat,_5UL>::~array(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::Mat, 5> filter_image(const cv::Mat& pretreat)
{
    std::array<cv::Mat, 5> result;
    std::array<std::future<cv::Mat>, 5> async_result {std::async(filter_yellow, pretreat),
        std::async(filter_red, pretreat), std::async(filter_blue, pretreat), std::async(filter_black, pretreat),
        std::async(filter_white, pretreat)};

    for(std::size_t i = 0; i < result.size(); i++)
    {
        result[i] = async_result[i].get();
    }
    return result;
}